

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3DropTable(Parse *pParse,SrcList *pName,int isView,int noErr)

{
  sqlite3 *db;
  Schema *pSVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Table *pTable;
  VTable *pVVar5;
  Vdbe *pVVar6;
  Schema **ppSVar7;
  byte *pbVar8;
  char *pcVar9;
  long lVar10;
  byte *pbVar11;
  char *pcVar12;
  long lVar13;
  byte *pbVar14;
  
  db = pParse->db;
  if ((db->mallocFailed != '\0') || (iVar2 = sqlite3ReadSchema(pParse), iVar2 != 0))
  goto LAB_0016219b;
  if (noErr != 0) {
    db->suppressErr = db->suppressErr + '\x01';
  }
  pTable = sqlite3LocateTableItem(pParse,isView,pName->a);
  if (noErr != 0) {
    db->suppressErr = db->suppressErr + 0xff;
  }
  if (pTable == (Table *)0x0) {
    if (noErr != 0) {
      sqlite3CodeVerifyNamedSchema(pParse,pName->a[0].zDatabase);
      sqlite3ForceNotReadOnly(pParse);
    }
    goto LAB_0016219b;
  }
  if (pTable->pSchema == (Schema *)0x0) {
    iVar2 = -0x8000;
  }
  else {
    iVar2 = -1;
    ppSVar7 = &db->aDb->pSchema;
    do {
      iVar2 = iVar2 + 1;
      pSVar1 = *ppSVar7;
      ppSVar7 = ppSVar7 + 4;
    } while (pSVar1 != pTable->pSchema);
  }
  if ((pTable->eTabType == '\x01') && (iVar3 = viewGetColumnNames(pParse,pTable), iVar3 != 0))
  goto LAB_0016219b;
  pcVar9 = "sqlite_master";
  if (iVar2 == 1) {
    pcVar9 = "sqlite_temp_master";
  }
  pcVar12 = db->aDb[iVar2].zDbSName;
  iVar3 = sqlite3AuthCheck(pParse,9,pcVar9,(char *)0x0,pcVar12);
  if (iVar3 != 0) goto LAB_0016219b;
  if (isView == 0) {
    if (pTable->eTabType == '\x01') {
      for (pVVar5 = (pTable->u).vtab.p; (pVVar5 != (VTable *)0x0 && (pVVar5->db != db));
          pVVar5 = pVVar5->pNext) {
      }
      pcVar9 = pVVar5->pMod->zName;
      iVar3 = 0x1e;
    }
    else {
      iVar3 = (uint)(iVar2 == 1) * 2 + 0xb;
      pcVar9 = (char *)0x0;
    }
  }
  else {
    iVar3 = (uint)(iVar2 != 1) * 2 + 0xf;
    pcVar9 = (char *)0x0;
  }
  iVar3 = sqlite3AuthCheck(pParse,iVar3,pTable->zName,pcVar9,pcVar12);
  if ((iVar3 != 0) ||
     (iVar3 = sqlite3AuthCheck(pParse,9,pTable->zName,(char *)0x0,pcVar12), iVar3 != 0))
  goto LAB_0016219b;
  pcVar9 = pTable->zName;
  iVar3 = sqlite3_strnicmp(pcVar9,"sqlite_",7);
  if (iVar3 == 0) {
    pbVar8 = (byte *)(pcVar9 + 7);
    lVar10 = 4;
    lVar13 = 0;
    pbVar14 = (byte *)0x1c5102;
    pbVar11 = pbVar8;
    do {
      if ((ulong)*pbVar11 == 0) {
        pbVar14 = (byte *)("tbl,idx,stat" + lVar13 + 8);
        goto LAB_001623e1;
      }
      if (""[*pbVar11] != ""[*pbVar14]) goto LAB_001623e1;
      pbVar11 = pbVar11 + 1;
      lVar13 = lVar13 + 1;
      pbVar14 = pbVar14 + 1;
      lVar10 = lVar10 + -1;
    } while (lVar10 != 0);
    lVar10 = 0;
    pbVar11 = (byte *)(pcVar9 + 0xb);
    pbVar14 = (byte *)0x1c5106;
LAB_001623e1:
    uVar4 = 0;
    if ((0 < (int)lVar10) && (""[*pbVar11] != ""[*pbVar14])) {
      lVar10 = 10;
      lVar13 = 0;
      pcVar12 = "parameters";
      do {
        if ((ulong)*pbVar8 == 0) {
          pcVar12 = "parameters" + lVar13;
          goto LAB_00162457;
        }
        if (""[*pbVar8] != ""[(byte)*pcVar12]) goto LAB_00162457;
        pbVar8 = pbVar8 + 1;
        lVar13 = lVar13 + 1;
        pcVar12 = (char *)((byte *)pcVar12 + 1);
        lVar10 = lVar10 + -1;
      } while (lVar10 != 0);
      lVar10 = 0;
      pbVar8 = (byte *)(pcVar9 + 0x11);
      pcVar12 = (char *)(byte *)0x1c339c;
LAB_00162457:
      if ((int)lVar10 < 1) {
        uVar4 = 0;
      }
      else {
        uVar4 = (uint)(""[*pbVar8] != ""[(byte)*pcVar12]);
      }
    }
  }
  else if (((((pTable->tabFlags >> 0xc & 1) == 0) || ((db->flags & 0x10000000) == 0)) ||
           (db->pVtabCtx != (VtabCtx *)0x0)) ||
          ((db->nVdbeExec != 0 || ((uVar4 = 1, 0 < db->nVTrans && (db->aVTrans == (VTable **)0x0))))
          )) {
    uVar4 = pTable->tabFlags >> 0xf & 1;
  }
  if (uVar4 == 0) {
    if (isView == 0) {
      if (pTable->eTabType != '\x02') goto LAB_001624b9;
      pcVar12 = "use DROP VIEW to delete view %s";
    }
    else {
      if (pTable->eTabType == '\x02') {
LAB_001624b9:
        pVVar6 = sqlite3GetVdbe(pParse);
        if (pVVar6 != (Vdbe *)0x0) {
          sqlite3BeginWriteOperation(pParse,1,iVar2);
          if (isView == 0) {
            sqlite3ClearStatTables(pParse,iVar2,"tbl",pTable->zName);
            sqlite3FkDropTable(pParse,pName,pTable);
          }
          sqlite3CodeDropTable(pParse,pTable,iVar2,isView);
        }
        goto LAB_0016219b;
      }
      pcVar12 = "use DROP TABLE to delete table %s";
    }
  }
  else {
    pcVar12 = "table %s may not be dropped";
  }
  sqlite3ErrorMsg(pParse,pcVar12,pcVar9);
LAB_0016219b:
  sqlite3SrcListDelete(db,pName);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3DropTable(Parse *pParse, SrcList *pName, int isView, int noErr){
  Table *pTab;
  Vdbe *v;
  sqlite3 *db = pParse->db;
  int iDb;

  if( db->mallocFailed ){
    goto exit_drop_table;
  }
  assert( pParse->nErr==0 );
  assert( pName->nSrc==1 );
  if( sqlite3ReadSchema(pParse) ) goto exit_drop_table;
  if( noErr ) db->suppressErr++;
  assert( isView==0 || isView==LOCATE_VIEW );
  pTab = sqlite3LocateTableItem(pParse, isView, &pName->a[0]);
  if( noErr ) db->suppressErr--;

  if( pTab==0 ){
    if( noErr ){
      sqlite3CodeVerifyNamedSchema(pParse, pName->a[0].zDatabase);
      sqlite3ForceNotReadOnly(pParse);
    }
    goto exit_drop_table;
  }
  iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
  assert( iDb>=0 && iDb<db->nDb );

  /* If pTab is a virtual table, call ViewGetColumnNames() to ensure
  ** it is initialized.
  */
  if( IsVirtual(pTab) && sqlite3ViewGetColumnNames(pParse, pTab) ){
    goto exit_drop_table;
  }
#ifndef SQLITE_OMIT_AUTHORIZATION
  {
    int code;
    const char *zTab = SCHEMA_TABLE(iDb);
    const char *zDb = db->aDb[iDb].zDbSName;
    const char *zArg2 = 0;
    if( sqlite3AuthCheck(pParse, SQLITE_DELETE, zTab, 0, zDb)){
      goto exit_drop_table;
    }
    if( isView ){
      if( !OMIT_TEMPDB && iDb==1 ){
        code = SQLITE_DROP_TEMP_VIEW;
      }else{
        code = SQLITE_DROP_VIEW;
      }
#ifndef SQLITE_OMIT_VIRTUALTABLE
    }else if( IsVirtual(pTab) ){
      code = SQLITE_DROP_VTABLE;
      zArg2 = sqlite3GetVTable(db, pTab)->pMod->zName;
#endif
    }else{
      if( !OMIT_TEMPDB && iDb==1 ){
        code = SQLITE_DROP_TEMP_TABLE;
      }else{
        code = SQLITE_DROP_TABLE;
      }
    }
    if( sqlite3AuthCheck(pParse, code, pTab->zName, zArg2, zDb) ){
      goto exit_drop_table;
    }
    if( sqlite3AuthCheck(pParse, SQLITE_DELETE, pTab->zName, 0, zDb) ){
      goto exit_drop_table;
    }
  }
#endif
  if( tableMayNotBeDropped(db, pTab) ){
    sqlite3ErrorMsg(pParse, "table %s may not be dropped", pTab->zName);
    goto exit_drop_table;
  }

#ifndef SQLITE_OMIT_VIEW
  /* Ensure DROP TABLE is not used on a view, and DROP VIEW is not used
  ** on a table.
  */
  if( isView && !IsView(pTab) ){
    sqlite3ErrorMsg(pParse, "use DROP TABLE to delete table %s", pTab->zName);
    goto exit_drop_table;
  }
  if( !isView && IsView(pTab) ){
    sqlite3ErrorMsg(pParse, "use DROP VIEW to delete view %s", pTab->zName);
    goto exit_drop_table;
  }
#endif

  /* Generate code to remove the table from the schema table
  ** on disk.
  */
  v = sqlite3GetVdbe(pParse);
  if( v ){
    sqlite3BeginWriteOperation(pParse, 1, iDb);
    if( !isView ){
      sqlite3ClearStatTables(pParse, iDb, "tbl", pTab->zName);
      sqlite3FkDropTable(pParse, pName, pTab);
    }
    sqlite3CodeDropTable(pParse, pTab, iDb, isView);
  }

exit_drop_table:
  sqlite3SrcListDelete(db, pName);
}